

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O2

string * sznet::sz_gethostname_abi_cxx11_(void)

{
  int iVar1;
  char *pcVar2;
  string *in_RDI;
  char local_118 [8];
  char buf [256];
  
  iVar1 = gethostname(local_118,0x100);
  if (iVar1 == 0) {
    pcVar2 = local_118;
    buf[0xf7] = '\0';
  }
  else {
    pcVar2 = "unknownhost";
  }
  std::__cxx11::string::string((string *)in_RDI,pcVar2,(allocator *)(buf + 0xff));
  return in_RDI;
}

Assistant:

string sz_gethostname()
{
	char buf[256];
	if (::gethostname(buf, sizeof(buf)) == 0)
	{
		buf[sizeof(buf) - 1] = '\0';
		return buf;
	}
	else
	{
		return "unknownhost";
	}
}